

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O1

void directories::MADPCreateResultsDir(string *method,string *problem)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  __nlink_t *p_Var6;
  string dir;
  stat statInfo;
  stringstream ss;
  long *local_2a0;
  long local_290;
  long lStack_288;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  long *local_260 [2];
  long local_250 [2];
  stat local_240;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  
  MADPGetResultsDir_abi_cxx11_();
  plVar3 = (long *)std::__cxx11::string::append((char *)local_260);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_270 = *plVar5;
    lStack_268 = plVar3[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar5;
    local_280 = (long *)*plVar3;
  }
  local_278 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_280,(ulong)(method->_M_dataplus)._M_p);
  p_Var6 = (__nlink_t *)(plVar3 + 2);
  if ((__nlink_t *)*plVar3 == p_Var6) {
    local_240.st_nlink = *p_Var6;
    local_240._24_8_ = plVar3[3];
    local_240.st_dev = (__dev_t)&local_240.st_nlink;
  }
  else {
    local_240.st_nlink = *p_Var6;
    local_240.st_dev = (__dev_t)*plVar3;
  }
  local_240.st_ino = plVar3[1];
  *plVar3 = (long)p_Var6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_240);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_1a0 = *plVar5;
    lStack_198 = plVar3[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *plVar5;
    local_1b0 = (long *)*plVar3;
  }
  local_1a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)(problem->_M_dataplus)._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_290 = *plVar5;
    lStack_288 = plVar3[3];
    local_2a0 = &local_290;
  }
  else {
    local_290 = *plVar5;
    local_2a0 = (long *)*plVar3;
  }
  lVar1 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((__nlink_t *)local_240.st_dev != &local_240.st_nlink) {
    operator_delete((void *)local_240.st_dev,local_240.st_nlink + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_260[0] != local_250) {
    operator_delete(local_260[0],local_250[0] + 1);
  }
  iVar2 = stat((char *)local_2a0,&local_240);
  if ((iVar2 != 0) || ((local_240.st_mode & 0xf000) != 0x4000)) {
    iVar2 = mkdir((char *)local_2a0,0x1ff);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"mkdir error for ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,(char *)local_2a0,lVar1);
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar4 = &PTR__E_0059bd80;
      std::__cxx11::stringbuf::str();
      __cxa_throw(puVar4,&E::typeinfo,E::~E);
    }
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,local_290 + 1);
  }
  return;
}

Assistant:

void directories::MADPCreateResultsDir(const string & method,
                                       const string & problem)
{
    string dir=MADPGetResultsDir() + "/" + method + "/" + problem;
    
    struct stat statInfo;
    if(stat(dir.c_str(),&statInfo)==0 &&
       S_ISDIR(statInfo.st_mode))
    {
#if 0
        cout << "Results dir " << dir << " already exists" << endl;
#endif
    }
    else
        if(mkdir(dir.c_str(),0777)!=0)
        {
            stringstream ss;
            ss << "mkdir error for " << dir;
            throw(E(ss));
        }
}